

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btUnionFind.cpp
# Opt level: O2

void __thiscall btUnionFind::~btUnionFind(btUnionFind *this)

{
  btAlignedObjectArray<btElement>::clear(&this->m_elements);
  btAlignedObjectArray<btElement>::~btAlignedObjectArray(&this->m_elements);
  return;
}

Assistant:

btUnionFind::~btUnionFind()
{
	Free();

}